

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conelinei_intersector.h
# Opt level: O2

void embree::avx2::ConeCurveMiIntersector1<8,_true>::intersect
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *line)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  ushort uVar5;
  ushort uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  Scene *pSVar12;
  Geometry *pGVar13;
  long lVar14;
  RTCFilterFunctionN p_Var15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  float fVar32;
  undefined1 auVar33 [32];
  float fVar34;
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  uint uVar66;
  uint uVar67;
  uint uVar68;
  ulong uVar69;
  float fVar70;
  undefined1 auVar71 [16];
  float fVar80;
  float fVar81;
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  float fVar82;
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [64];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined4 uVar94;
  float fVar95;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  float fVar108;
  float fVar109;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  float fVar128;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  undefined1 auVar129 [32];
  undefined1 auVar130 [64];
  float fVar144;
  float fVar145;
  float fVar146;
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [64];
  float fVar147;
  float fVar148;
  float fVar155;
  float fVar156;
  float fVar157;
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [64];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [64];
  float fVar163;
  undefined1 auVar164 [28];
  float fVar169;
  float fVar170;
  float fVar171;
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [64];
  undefined1 auVar172 [28];
  undefined1 auVar173 [32];
  undefined1 auVar174 [64];
  undefined1 auVar175 [64];
  float fVar176;
  float fVar180;
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar185;
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [64];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [64];
  undefined1 auVar189 [32];
  undefined1 auVar190 [64];
  float fVar191;
  float fVar194;
  float fVar195;
  float fVar196;
  undefined1 auVar192 [32];
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vbool<8> valid;
  RoundLineIntersectorHitM<8> hit;
  int local_5ec;
  RayQueryContext *local_5e8;
  RTCFilterFunctionNArguments local_5e0;
  float local_5b0;
  undefined4 local_5ac;
  undefined4 local_5a8;
  undefined4 local_5a4;
  undefined4 local_5a0;
  uint local_59c;
  uint local_598;
  uint local_594;
  uint local_590;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  undefined1 local_520 [32];
  undefined1 local_500 [16];
  undefined1 auStack_4f0 [16];
  undefined1 local_4e0 [16];
  undefined1 auStack_4d0 [16];
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4a4;
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined1 local_280 [32];
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [16];
  undefined1 auStack_230 [16];
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  undefined1 local_1a0 [8];
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  undefined4 uStack_184;
  uint local_180 [4];
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  float local_100;
  float fStack_fc;
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  float local_a0;
  float fStack_9c;
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  undefined1 local_80 [32];
  undefined1 auVar193 [64];
  
  local_5e8 = context;
  pSVar12 = context->scene;
  local_180[0] = line->sharedGeomID;
  uVar66 = (line->v0).field_0.i[0];
  local_3a0._0_8_ = pSVar12;
  pGVar13 = (pSVar12->geometries).items[local_180[0]].ptr;
  lVar14 = *(long *)&pGVar13[1].time_range.upper;
  p_Var15 = pGVar13[1].intersectionFilterN;
  uVar68 = (line->v0).field_0.i[1];
  uVar67 = (line->v0).field_0.i[2];
  uVar7 = (line->v0).field_0.i[4];
  uVar8 = (line->v0).field_0.i[5];
  auVar92._16_16_ = *(undefined1 (*) [16])(lVar14 + (ulong)uVar7 * (long)p_Var15);
  auVar92._0_16_ = *(undefined1 (*) [16])(lVar14 + (ulong)uVar66 * (long)p_Var15);
  auVar83._16_16_ = *(undefined1 (*) [16])(lVar14 + (ulong)uVar8 * (long)p_Var15);
  auVar83._0_16_ = *(undefined1 (*) [16])(lVar14 + (ulong)uVar68 * (long)p_Var15);
  uVar9 = (line->v0).field_0.i[6];
  auVar96._16_16_ = *(undefined1 (*) [16])(lVar14 + (ulong)uVar9 * (long)p_Var15);
  auVar96._0_16_ = *(undefined1 (*) [16])(lVar14 + (ulong)uVar67 * (long)p_Var15);
  uVar10 = (line->v0).field_0.i[3];
  uVar11 = (line->v0).field_0.i[7];
  auVar106._16_16_ = *(undefined1 (*) [16])(lVar14 + (ulong)uVar11 * (long)p_Var15);
  auVar106._0_16_ = *(undefined1 (*) [16])(lVar14 + (ulong)uVar10 * (long)p_Var15);
  auVar71 = *(undefined1 (*) [16])(lVar14 + (ulong)(uVar7 + 1) * (long)p_Var15);
  auVar110._0_16_ =
       ZEXT116(0) * auVar71 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar14 + (ulong)(uVar66 + 1) * (long)p_Var15);
  auVar110._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar71;
  auVar71 = *(undefined1 (*) [16])(lVar14 + (ulong)(uVar8 + 1) * (long)p_Var15);
  auVar158._0_16_ =
       ZEXT116(0) * auVar71 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar14 + (ulong)(uVar68 + 1) * (long)p_Var15);
  auVar158._16_16_ = ZEXT116(1) * auVar71;
  auVar71 = *(undefined1 (*) [16])(lVar14 + (ulong)(uVar9 + 1) * (long)p_Var15);
  auVar165._0_16_ =
       ZEXT116(0) * auVar71 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar14 + (ulong)(uVar67 + 1) * (long)p_Var15);
  auVar165._16_16_ = ZEXT116(1) * auVar71;
  auVar71 = *(undefined1 (*) [16])(lVar14 + (ulong)(uVar11 + 1) * (long)p_Var15);
  auVar149._0_16_ =
       ZEXT116(0) * auVar71 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar14 + (ulong)(uVar10 + 1) * (long)p_Var15);
  auVar149._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar71;
  auVar91 = vunpcklps_avx(auVar92,auVar96);
  auVar93 = vunpckhps_avx(auVar92,auVar96);
  auVar89 = vunpcklps_avx(auVar83,auVar106);
  auVar141 = vunpckhps_avx(auVar83,auVar106);
  auVar178 = vunpcklps_avx(auVar91,auVar89);
  auVar91 = vunpckhps_avx(auVar91,auVar89);
  auVar187 = vunpcklps_avx(auVar93,auVar141);
  auVar89 = vunpckhps_avx(auVar93,auVar141);
  auVar92 = vpunpckldq_avx2(auVar110,auVar165);
  auVar93 = vpunpckhdq_avx2(auVar110,auVar165);
  auVar83 = vpunpckldq_avx2(auVar158,auVar149);
  auVar141 = vpunpckhdq_avx2(auVar158,auVar149);
  auVar106 = vpunpckldq_avx2(auVar92,auVar83);
  auVar83 = vpunpckhdq_avx2(auVar92,auVar83);
  auVar110 = vpunpckldq_avx2(auVar93,auVar141);
  auVar96 = vpunpckhdq_avx2(auVar93,auVar141);
  uVar5 = line->leftExists;
  uVar6 = line->rightExists;
  auVar93 = vpcmpeqd_avx2(auVar93,auVar93);
  auVar92 = vpcmpeqd_avx2(auVar93,(undefined1  [32])(line->primIDs).field_0);
  local_180[1] = local_180[0];
  local_180[2] = local_180[0];
  local_180[3] = local_180[0];
  uStack_170 = local_180[0];
  uStack_16c = local_180[0];
  uStack_168 = local_180[0];
  uStack_164 = local_180[0];
  auVar93._0_16_ = *(undefined1 (*) [16])&(ray->super_RayK<1>).dir;
  auVar93._16_4_ = (ray->super_RayK<1>).tfar;
  auVar93._20_4_ = (ray->super_RayK<1>).mask;
  auVar93._24_4_ = (ray->super_RayK<1>).id;
  auVar93._28_4_ = (ray->super_RayK<1>).flags;
  auVar141 = *(undefined1 (*) [32])((long)&(ray->super_RayK<1>).dir.field_0 + 4);
  fVar1 = (ray->super_RayK<1>).dir.field_0.m128[2];
  fVar2 = (ray->super_RayK<1>).dir.field_0.m128[3];
  fVar148 = (ray->super_RayK<1>).tfar;
  fVar3 = (float)(ray->super_RayK<1>).mask;
  fVar4 = (float)(ray->super_RayK<1>).id;
  fVar16 = (float)(ray->super_RayK<1>).flags;
  fVar17 = (ray->Ng).field_0.field_0.x;
  auVar30._4_4_ = fVar2 * fVar2;
  auVar30._0_4_ = fVar1 * fVar1;
  auVar30._8_4_ = fVar148 * fVar148;
  auVar30._12_4_ = fVar3 * fVar3;
  auVar30._16_4_ = fVar4 * fVar4;
  auVar30._20_4_ = fVar16 * fVar16;
  auVar30._24_4_ = fVar17 * fVar17;
  auVar30._28_4_ = (ray->Ng).field_0.field_0.y;
  auVar71 = vfmadd231ps_fma(auVar30,auVar141,auVar141);
  auVar71 = vfmadd231ps_fma(ZEXT1632(auVar71),auVar93,auVar93);
  uVar94 = auVar71._0_4_;
  auVar72._4_4_ = uVar94;
  auVar72._0_4_ = uVar94;
  auVar72._8_4_ = uVar94;
  auVar72._12_4_ = uVar94;
  auVar72._16_4_ = uVar94;
  auVar72._20_4_ = uVar94;
  auVar72._24_4_ = uVar94;
  auVar72._28_4_ = uVar94;
  auVar93 = vrcpps_avx(auVar72);
  fVar1 = (ray->super_RayK<1>).org.field_0.m128[1];
  auVar84._4_4_ = fVar1;
  auVar84._0_4_ = fVar1;
  auVar84._8_4_ = fVar1;
  auVar84._12_4_ = fVar1;
  auVar84._16_4_ = fVar1;
  auVar84._20_4_ = fVar1;
  auVar84._24_4_ = fVar1;
  auVar84._28_4_ = fVar1;
  auVar111._8_4_ = 0x3f800000;
  auVar111._0_8_ = 0x3f8000003f800000;
  auVar111._12_4_ = 0x3f800000;
  auVar111._16_4_ = 0x3f800000;
  auVar111._20_4_ = 0x3f800000;
  auVar111._24_4_ = 0x3f800000;
  auVar111._28_4_ = 0x3f800000;
  auVar71 = vfnmadd213ps_fma(auVar72,auVar93,auVar111);
  auVar71 = vfmadd132ps_fma(ZEXT1632(auVar71),auVar93,auVar93);
  auVar97._4_4_ = (auVar106._4_4_ + auVar178._4_4_) * 0.5;
  auVar97._0_4_ = (auVar106._0_4_ + auVar178._0_4_) * 0.5;
  auVar97._8_4_ = (auVar106._8_4_ + auVar178._8_4_) * 0.5;
  auVar97._12_4_ = (auVar106._12_4_ + auVar178._12_4_) * 0.5;
  auVar97._16_4_ = (auVar106._16_4_ + auVar178._16_4_) * 0.5;
  auVar97._20_4_ = (auVar106._20_4_ + auVar178._20_4_) * 0.5;
  auVar97._24_4_ = (auVar106._24_4_ + auVar178._24_4_) * 0.5;
  auVar97._28_4_ = auVar106._28_4_ + auVar178._28_4_;
  auVar141._4_4_ = (auVar83._4_4_ + auVar91._4_4_) * 0.5;
  auVar141._0_4_ = (auVar83._0_4_ + auVar91._0_4_) * 0.5;
  auVar141._8_4_ = (auVar83._8_4_ + auVar91._8_4_) * 0.5;
  auVar141._12_4_ = (auVar83._12_4_ + auVar91._12_4_) * 0.5;
  auVar141._16_4_ = (auVar83._16_4_ + auVar91._16_4_) * 0.5;
  auVar141._20_4_ = (auVar83._20_4_ + auVar91._20_4_) * 0.5;
  auVar141._24_4_ = (auVar83._24_4_ + auVar91._24_4_) * 0.5;
  auVar141._28_4_ = auVar83._28_4_ + auVar91._28_4_;
  auVar129._4_4_ = (auVar187._4_4_ + auVar110._4_4_) * 0.5;
  auVar129._0_4_ = (auVar187._0_4_ + auVar110._0_4_) * 0.5;
  auVar129._8_4_ = (auVar187._8_4_ + auVar110._8_4_) * 0.5;
  auVar129._12_4_ = (auVar187._12_4_ + auVar110._12_4_) * 0.5;
  auVar129._16_4_ = (auVar187._16_4_ + auVar110._16_4_) * 0.5;
  auVar129._20_4_ = (auVar187._20_4_ + auVar110._20_4_) * 0.5;
  auVar129._24_4_ = (auVar187._24_4_ + auVar110._24_4_) * 0.5;
  auVar129._28_4_ = auVar187._28_4_ + auVar110._28_4_;
  fVar2 = (ray->super_RayK<1>).org.field_0.m128[2];
  auVar173._4_4_ = fVar2;
  auVar173._0_4_ = fVar2;
  auVar173._8_4_ = fVar2;
  auVar173._12_4_ = fVar2;
  auVar173._16_4_ = fVar2;
  auVar173._20_4_ = fVar2;
  auVar173._24_4_ = fVar2;
  auVar173._28_4_ = fVar2;
  auVar93 = vsubps_avx(auVar141,auVar84);
  auVar141 = vsubps_avx(auVar129,auVar173);
  local_2c0 = (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar31._4_4_ = auVar141._4_4_ * local_2c0;
  auVar31._0_4_ = auVar141._0_4_ * local_2c0;
  auVar31._8_4_ = auVar141._8_4_ * local_2c0;
  auVar31._12_4_ = auVar141._12_4_ * local_2c0;
  auVar31._16_4_ = auVar141._16_4_ * local_2c0;
  auVar31._20_4_ = auVar141._20_4_ * local_2c0;
  auVar31._24_4_ = auVar141._24_4_ * local_2c0;
  auVar31._28_4_ = auVar141._28_4_;
  fVar148 = (ray->super_RayK<1>).dir.field_0.m128[1];
  local_1c0._4_4_ = fVar148;
  local_1c0._0_4_ = fVar148;
  fStack_1b8 = fVar148;
  fStack_1b4 = fVar148;
  fStack_1b0 = fVar148;
  fStack_1ac = fVar148;
  fStack_1a8 = fVar148;
  register0x0000155c = fVar148;
  auVar27 = vfmadd231ps_fma(auVar31,_local_1c0,auVar93);
  fVar3 = (ray->super_RayK<1>).org.field_0.m128[0];
  auVar112._4_4_ = fVar3;
  auVar112._0_4_ = fVar3;
  auVar112._8_4_ = fVar3;
  auVar112._12_4_ = fVar3;
  auVar112._16_4_ = fVar3;
  auVar112._20_4_ = fVar3;
  auVar112._24_4_ = fVar3;
  auVar112._28_4_ = fVar3;
  fVar4 = (ray->super_RayK<1>).dir.field_0.m128[0];
  local_480._4_4_ = fVar4;
  local_480._0_4_ = fVar4;
  local_480._8_4_ = fVar4;
  local_480._12_4_ = fVar4;
  local_480._16_4_ = fVar4;
  local_480._20_4_ = fVar4;
  local_480._24_4_ = fVar4;
  local_480._28_4_ = fVar4;
  auVar93 = vsubps_avx(auVar97,auVar112);
  auVar27 = vfmadd231ps_fma(ZEXT1632(auVar27),local_480,auVar93);
  fVar147 = auVar27._0_4_ * auVar71._0_4_;
  fVar155 = auVar27._4_4_ * auVar71._4_4_;
  fVar156 = auVar27._8_4_ * auVar71._8_4_;
  fVar157 = auVar27._12_4_ * auVar71._12_4_;
  fStack_4a4 = auVar149._28_4_;
  auVar73._0_4_ = fVar3 + fVar4 * fVar147;
  auVar73._4_4_ = fVar3 + fVar4 * fVar155;
  auVar73._8_4_ = fVar3 + fVar4 * fVar156;
  auVar73._12_4_ = fVar3 + fVar4 * fVar157;
  auVar73._16_4_ = fVar3 + fVar4 * 0.0;
  auVar73._20_4_ = fVar3 + fVar4 * 0.0;
  auVar73._24_4_ = fVar3 + fVar4 * 0.0;
  auVar73._28_4_ = fVar3 + 0.0;
  auVar113._0_4_ = fVar1 + fVar148 * fVar147;
  auVar113._4_4_ = fVar1 + fVar148 * fVar155;
  auVar113._8_4_ = fVar1 + fVar148 * fVar156;
  auVar113._12_4_ = fVar1 + fVar148 * fVar157;
  auVar113._16_4_ = fVar1 + fVar148 * 0.0;
  auVar113._20_4_ = fVar1 + fVar148 * 0.0;
  auVar113._24_4_ = fVar1 + fVar148 * 0.0;
  auVar113._28_4_ = fVar1 + auVar93._28_4_;
  _local_4c0 = ZEXT1628(CONCAT412(fVar157,CONCAT48(fVar156,CONCAT44(fVar155,fVar147))));
  auVar166._0_4_ = fVar2 + local_2c0 * fVar147;
  auVar166._4_4_ = fVar2 + local_2c0 * fVar155;
  auVar166._8_4_ = fVar2 + local_2c0 * fVar156;
  auVar166._12_4_ = fVar2 + local_2c0 * fVar157;
  auVar166._16_4_ = fVar2 + local_2c0 * 0.0;
  auVar166._20_4_ = fVar2 + local_2c0 * 0.0;
  auVar166._24_4_ = fVar2 + local_2c0 * 0.0;
  auVar166._28_4_ = fVar2 + fVar1;
  local_300 = vsubps_avx(auVar106,auVar178);
  _local_1e0 = vsubps_avx(auVar73,auVar178);
  local_320 = vsubps_avx(auVar83,auVar91);
  _local_200 = vsubps_avx(auVar113,auVar91);
  local_340 = vsubps_avx(auVar110,auVar187);
  local_2e0 = vsubps_avx(auVar166,auVar187);
  fVar17 = local_340._0_4_;
  fVar20 = local_340._4_4_;
  auVar178._4_4_ = fVar20 * fVar20;
  auVar178._0_4_ = fVar17 * fVar17;
  fVar21 = local_340._8_4_;
  auVar178._8_4_ = fVar21 * fVar21;
  fVar22 = local_340._12_4_;
  auVar178._12_4_ = fVar22 * fVar22;
  fVar23 = local_340._16_4_;
  auVar178._16_4_ = fVar23 * fVar23;
  fVar24 = local_340._20_4_;
  auVar178._20_4_ = fVar24 * fVar24;
  fVar25 = local_340._24_4_;
  auVar178._24_4_ = fVar25 * fVar25;
  auVar178._28_4_ = auVar91._28_4_;
  auVar71 = vfmadd231ps_fma(auVar178,local_320,local_320);
  auVar71 = vfmadd231ps_fma(ZEXT1632(auVar71),local_300,local_300);
  fVar176 = local_2e0._0_4_;
  fVar180 = local_2e0._4_4_;
  auVar91._4_4_ = fVar180 * fVar20;
  auVar91._0_4_ = fVar176 * fVar17;
  fVar181 = local_2e0._8_4_;
  auVar91._8_4_ = fVar181 * fVar21;
  fVar182 = local_2e0._12_4_;
  auVar91._12_4_ = fVar182 * fVar22;
  fVar183 = local_2e0._16_4_;
  auVar91._16_4_ = fVar183 * fVar23;
  fVar184 = local_2e0._20_4_;
  auVar91._20_4_ = fVar184 * fVar24;
  fVar185 = local_2e0._24_4_;
  auVar91._24_4_ = fVar185 * fVar25;
  auVar91._28_4_ = fVar2;
  auVar27 = vfmadd231ps_fma(auVar91,_local_200,local_320);
  auVar27 = vfmadd231ps_fma(ZEXT1632(auVar27),_local_1e0,local_300);
  auVar187._4_4_ = local_2c0 * fVar20;
  auVar187._0_4_ = local_2c0 * fVar17;
  auVar187._8_4_ = local_2c0 * fVar21;
  auVar187._12_4_ = local_2c0 * fVar22;
  auVar187._16_4_ = local_2c0 * fVar23;
  auVar187._20_4_ = local_2c0 * fVar24;
  auVar187._24_4_ = local_2c0 * fVar25;
  auVar187._28_4_ = auVar166._28_4_;
  auVar28 = vfmadd231ps_fma(auVar187,_local_1c0,local_320);
  auVar28 = vfmadd231ps_fma(ZEXT1632(auVar28),local_480,local_300);
  auVar141 = vsubps_avx(auVar89,auVar96);
  fVar18 = auVar141._0_4_;
  fVar109 = auVar141._4_4_;
  fVar119 = auVar141._8_4_;
  fVar123 = auVar141._12_4_;
  fVar127 = auVar141._16_4_;
  fVar144 = auVar141._20_4_;
  fVar145 = auVar141._24_4_;
  fVar32 = local_300._28_4_;
  fVar1 = auVar71._0_4_;
  fVar108 = fVar18 * fVar18 + fVar1;
  fVar2 = auVar71._4_4_;
  fVar116 = fVar109 * fVar109 + fVar2;
  fVar3 = auVar71._8_4_;
  fVar118 = fVar119 * fVar119 + fVar3;
  fVar16 = auVar71._12_4_;
  fVar120 = fVar123 * fVar123 + fVar16;
  fVar122 = fVar127 * fVar127 + 0.0;
  fVar124 = fVar144 * fVar144 + 0.0;
  fVar126 = fVar145 * fVar145 + 0.0;
  fStack_2bc = local_2c0;
  fStack_2b8 = local_2c0;
  fStack_2b4 = local_2c0;
  fStack_2b0 = local_2c0;
  fStack_2ac = local_2c0;
  fStack_2a8 = local_2c0;
  fStack_2a4 = local_2c0;
  auVar33._4_4_ = local_2c0 * fVar180;
  auVar33._0_4_ = local_2c0 * fVar176;
  auVar33._8_4_ = local_2c0 * fVar181;
  auVar33._12_4_ = local_2c0 * fVar182;
  auVar33._16_4_ = local_2c0 * fVar183;
  auVar33._20_4_ = local_2c0 * fVar184;
  auVar33._24_4_ = local_2c0 * fVar185;
  auVar33._28_4_ = fVar32;
  auVar29 = vfmadd231ps_fma(auVar33,_local_1c0,_local_200);
  auVar29 = vfmadd231ps_fma(ZEXT1632(auVar29),local_480,_local_1e0);
  fVar191 = fVar1 * fVar1;
  fVar194 = fVar2 * fVar2;
  fVar195 = fVar3 * fVar3;
  fVar196 = fVar16 * fVar16;
  uStack_184 = local_2c0;
  _local_1a0 = ZEXT1628(CONCAT412(fVar196,CONCAT48(fVar195,CONCAT44(fVar194,fVar191))));
  fVar19 = auVar27._0_4_;
  fVar163 = auVar28._0_4_;
  fVar117 = auVar27._4_4_;
  fVar169 = auVar28._4_4_;
  fVar121 = auVar27._8_4_;
  fVar170 = auVar28._8_4_;
  fVar125 = auVar27._12_4_;
  fVar171 = auVar28._12_4_;
  fVar34 = local_320._28_4_;
  auVar35._4_4_ = fVar116 * fVar169 * fVar117;
  auVar35._0_4_ = fVar108 * fVar163 * fVar19;
  auVar35._8_4_ = fVar118 * fVar170 * fVar121;
  auVar35._12_4_ = fVar120 * fVar171 * fVar125;
  auVar35._16_4_ = fVar122 * 0.0;
  auVar35._20_4_ = fVar124 * 0.0;
  auVar35._24_4_ = fVar126 * 0.0;
  auVar35._28_4_ = fVar34;
  auVar93 = vsubps_avx(ZEXT1632(CONCAT412(fVar196 * auVar29._12_4_,
                                          CONCAT48(fVar195 * auVar29._8_4_,
                                                   CONCAT44(fVar194 * auVar29._4_4_,
                                                            fVar191 * auVar29._0_4_)))),auVar35);
  auVar129 = ZEXT1632(auVar71);
  fVar128 = auVar89._0_4_;
  fVar95 = fVar128 * fVar1;
  fVar131 = auVar89._4_4_;
  fVar100 = fVar131 * fVar2;
  auVar36._4_4_ = fVar100;
  auVar36._0_4_ = fVar95;
  fVar132 = auVar89._8_4_;
  fVar101 = fVar132 * fVar3;
  auVar36._8_4_ = fVar101;
  fVar133 = auVar89._12_4_;
  fVar102 = fVar133 * fVar16;
  auVar36._12_4_ = fVar102;
  fVar134 = auVar89._16_4_;
  fVar103 = fVar134 * 0.0;
  auVar36._16_4_ = fVar103;
  fVar135 = auVar89._20_4_;
  fVar104 = fVar135 * 0.0;
  auVar36._20_4_ = fVar104;
  fVar136 = auVar89._24_4_;
  fVar105 = fVar136 * 0.0;
  auVar36._24_4_ = fVar105;
  auVar36._28_4_ = fVar34;
  fVar146 = auVar89._28_4_;
  auVar137._0_4_ = fVar95 * fVar163 * fVar18 + auVar93._0_4_;
  auVar137._4_4_ = fVar100 * fVar169 * fVar109 + auVar93._4_4_;
  auVar137._8_4_ = fVar101 * fVar170 * fVar119 + auVar93._8_4_;
  auVar137._12_4_ = fVar102 * fVar171 * fVar123 + auVar93._12_4_;
  auVar137._16_4_ = fVar103 * fVar127 * 0.0 + auVar93._16_4_;
  auVar137._20_4_ = fVar104 * fVar144 * 0.0 + auVar93._20_4_;
  auVar137._24_4_ = fVar105 * fVar145 * 0.0 + auVar93._24_4_;
  auVar137._28_4_ = fVar146 + auVar93._28_4_;
  auVar89._4_4_ = fVar180 * fVar180;
  auVar89._0_4_ = fVar176 * fVar176;
  auVar89._8_4_ = fVar181 * fVar181;
  auVar89._12_4_ = fVar182 * fVar182;
  auVar89._16_4_ = fVar183 * fVar183;
  auVar89._20_4_ = fVar184 * fVar184;
  auVar89._24_4_ = fVar185 * fVar185;
  auVar89._28_4_ = auVar93._28_4_;
  auVar187 = _local_200;
  auVar71 = vfmadd231ps_fma(auVar89,_local_200,_local_200);
  auVar30 = _local_1e0;
  auVar71 = vfmadd231ps_fma(ZEXT1632(auVar71),_local_1e0,_local_1e0);
  auVar37._4_4_ = fVar116 * fVar117 * fVar117;
  auVar37._0_4_ = fVar108 * fVar19 * fVar19;
  auVar37._8_4_ = fVar118 * fVar121 * fVar121;
  auVar37._12_4_ = fVar120 * fVar125 * fVar125;
  auVar37._16_4_ = fVar122 * 0.0;
  auVar37._20_4_ = fVar124 * 0.0;
  auVar37._24_4_ = fVar126 * 0.0;
  auVar37._28_4_ = fVar146;
  auVar93 = vsubps_avx(ZEXT1632(CONCAT412(fVar196 * auVar71._12_4_,
                                          CONCAT48(fVar195 * auVar71._8_4_,
                                                   CONCAT44(fVar194 * auVar71._4_4_,
                                                            fVar191 * auVar71._0_4_)))),auVar37);
  auVar38._4_4_ = fVar117 * (fVar109 + fVar109);
  auVar38._0_4_ = fVar19 * (fVar18 + fVar18);
  auVar38._8_4_ = fVar121 * (fVar119 + fVar119);
  auVar38._12_4_ = fVar125 * (fVar123 + fVar123);
  auVar38._16_4_ = (fVar127 + fVar127) * 0.0;
  auVar38._20_4_ = (fVar144 + fVar144) * 0.0;
  auVar38._24_4_ = (fVar145 + fVar145) * 0.0;
  auVar38._28_4_ = auVar141._28_4_ + auVar141._28_4_;
  auVar91 = vsubps_avx(auVar38,auVar36);
  fVar70 = fVar163 * fVar163;
  fVar80 = fVar169 * fVar169;
  fVar81 = fVar170 * fVar170;
  fVar82 = fVar171 * fVar171;
  auVar39._4_4_ = fVar116 * fVar80;
  auVar39._0_4_ = fVar108 * fVar70;
  auVar39._8_4_ = fVar118 * fVar81;
  auVar39._12_4_ = fVar120 * fVar82;
  auVar39._16_4_ = fVar122 * 0.0;
  auVar39._20_4_ = fVar124 * 0.0;
  auVar39._24_4_ = fVar126 * 0.0;
  auVar39._28_4_ = auVar93._28_4_;
  auVar89 = vsubps_avx(_local_1a0,auVar39);
  auVar40._4_4_ = auVar89._4_4_ * (auVar93._4_4_ + fVar100 * auVar91._4_4_);
  auVar40._0_4_ = auVar89._0_4_ * (auVar93._0_4_ + fVar95 * auVar91._0_4_);
  auVar40._8_4_ = auVar89._8_4_ * (auVar93._8_4_ + fVar101 * auVar91._8_4_);
  auVar40._12_4_ = auVar89._12_4_ * (auVar93._12_4_ + fVar102 * auVar91._12_4_);
  auVar40._16_4_ = auVar89._16_4_ * (auVar93._16_4_ + fVar103 * auVar91._16_4_);
  auVar40._20_4_ = auVar89._20_4_ * (auVar93._20_4_ + fVar104 * auVar91._20_4_);
  auVar40._24_4_ = auVar89._24_4_ * (auVar93._24_4_ + fVar105 * auVar91._24_4_);
  auVar40._28_4_ = auVar93._28_4_ + fVar34;
  auVar41._4_4_ = auVar137._4_4_ * auVar137._4_4_;
  auVar41._0_4_ = auVar137._0_4_ * auVar137._0_4_;
  auVar41._8_4_ = auVar137._8_4_ * auVar137._8_4_;
  auVar41._12_4_ = auVar137._12_4_ * auVar137._12_4_;
  auVar41._16_4_ = auVar137._16_4_ * auVar137._16_4_;
  auVar41._20_4_ = auVar137._20_4_ * auVar137._20_4_;
  auVar41._24_4_ = auVar137._24_4_ * auVar137._24_4_;
  auVar41._28_4_ = auVar91._28_4_;
  auVar91 = vsubps_avx(auVar41,auVar40);
  auVar97 = ZEXT1232(ZEXT412(0)) << 0x20;
  auVar93 = vcmpps_avx(auVar91,auVar97,5);
  auVar178 = auVar93 & ~auVar92;
  if ((((((((auVar178 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
           (auVar178 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (auVar178 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
         SUB321(auVar178 >> 0x7f,0) == '\0') &&
        (auVar178 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
       SUB321(auVar178 >> 0xbf,0) == '\0') &&
      (auVar178 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar178[0x1f]) {
    return;
  }
  auVar93 = vandnps_avx(auVar92,auVar93);
  auVar71 = vpackssdw_avx(auVar93._0_16_,auVar93._16_16_);
  auVar106 = vsubps_avx(auVar73,auVar106);
  auVar83 = vsubps_avx(auVar113,auVar83);
  auVar92 = vsubps_avx(auVar166,auVar110);
  auVar150._2_2_ = 0;
  auVar150._0_2_ = uVar6;
  auVar150._4_2_ = uVar6;
  auVar150._6_2_ = 0;
  auVar150._8_2_ = uVar6;
  auVar150._10_2_ = 0;
  auVar150._12_2_ = uVar6;
  auVar150._14_2_ = 0;
  auVar150._16_2_ = uVar6;
  auVar150._18_2_ = 0;
  auVar150._20_2_ = uVar6;
  auVar150._22_2_ = 0;
  auVar150._24_2_ = uVar6;
  auVar150._26_2_ = 0;
  auVar150._28_2_ = uVar6;
  auVar150._30_2_ = 0;
  auVar178 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar93 = vpand_avx2(auVar178,auVar150);
  auVar93 = vpcmpeqd_avx2(auVar93,auVar97);
  auVar27 = vpackssdw_avx(auVar93._0_16_,auVar93._16_16_);
  auVar151._2_2_ = 0;
  auVar151._0_2_ = uVar5;
  auVar151._4_2_ = uVar5;
  auVar151._6_2_ = 0;
  auVar151._8_2_ = uVar5;
  auVar151._10_2_ = 0;
  auVar151._12_2_ = uVar5;
  auVar151._14_2_ = 0;
  auVar151._16_2_ = uVar5;
  auVar151._18_2_ = 0;
  auVar151._20_2_ = uVar5;
  auVar151._22_2_ = 0;
  auVar151._24_2_ = uVar5;
  auVar151._26_2_ = 0;
  auVar151._28_2_ = uVar5;
  auVar151._30_2_ = 0;
  auVar91 = vsqrtps_avx(auVar91);
  auVar110 = vpand_avx2(auVar178,auVar151);
  auVar93 = vrcpps_avx(auVar89);
  auVar186._8_4_ = 0x3f800000;
  auVar186._0_8_ = 0x3f8000003f800000;
  auVar186._12_4_ = 0x3f800000;
  auVar186._16_4_ = 0x3f800000;
  auVar186._20_4_ = 0x3f800000;
  auVar186._24_4_ = 0x3f800000;
  auVar186._28_4_ = 0x3f800000;
  auVar29 = vfnmadd213ps_fma(auVar93,auVar89,auVar186);
  auVar74._8_4_ = 0x7fffffff;
  auVar74._0_8_ = 0x7fffffff7fffffff;
  auVar74._12_4_ = 0x7fffffff;
  auVar74._16_4_ = 0x7fffffff;
  auVar74._20_4_ = 0x7fffffff;
  auVar74._24_4_ = 0x7fffffff;
  auVar74._28_4_ = 0x7fffffff;
  auVar29 = vfmadd132ps_fma(ZEXT1632(auVar29),auVar93,auVar93);
  auVar93 = vandps_avx(auVar89,auVar74);
  auVar85._8_4_ = 0x219392ef;
  auVar85._0_8_ = 0x219392ef219392ef;
  auVar85._12_4_ = 0x219392ef;
  auVar85._16_4_ = 0x219392ef;
  auVar85._20_4_ = 0x219392ef;
  auVar85._24_4_ = 0x219392ef;
  auVar85._28_4_ = 0x219392ef;
  auVar93 = vcmpps_avx(auVar93,auVar85,2);
  uVar69 = CONCAT44(auVar137._4_4_,auVar137._0_4_);
  auVar86._0_8_ = uVar69 ^ 0x8000000080000000;
  auVar86._8_4_ = -auVar137._8_4_;
  auVar86._12_4_ = -auVar137._12_4_;
  auVar86._16_4_ = -auVar137._16_4_;
  auVar86._20_4_ = -auVar137._20_4_;
  auVar86._24_4_ = -auVar137._24_4_;
  auVar86._28_4_ = -auVar137._28_4_;
  auVar89 = vsubps_avx(auVar86,auVar91);
  auVar178 = vsubps_avx(auVar91,auVar137);
  auVar42._4_4_ = auVar29._4_4_ * auVar89._4_4_;
  auVar42._0_4_ = auVar29._0_4_ * auVar89._0_4_;
  auVar42._8_4_ = auVar29._8_4_ * auVar89._8_4_;
  auVar42._12_4_ = auVar29._12_4_ * auVar89._12_4_;
  auVar42._16_4_ = auVar89._16_4_ * 0.0;
  auVar42._20_4_ = auVar89._20_4_ * 0.0;
  auVar42._24_4_ = auVar89._24_4_ * 0.0;
  auVar42._28_4_ = auVar137._28_4_;
  auVar43._4_4_ = auVar29._4_4_ * auVar178._4_4_;
  auVar43._0_4_ = auVar29._0_4_ * auVar178._0_4_;
  auVar43._8_4_ = auVar29._8_4_ * auVar178._8_4_;
  auVar43._12_4_ = auVar29._12_4_ * auVar178._12_4_;
  auVar43._16_4_ = auVar178._16_4_ * 0.0;
  auVar43._20_4_ = auVar178._20_4_ * 0.0;
  auVar43._24_4_ = auVar178._24_4_ * 0.0;
  auVar43._28_4_ = auVar178._28_4_;
  auVar114._8_4_ = 0xff800000;
  auVar114._0_8_ = 0xff800000ff800000;
  auVar114._12_4_ = 0xff800000;
  auVar114._16_4_ = 0xff800000;
  auVar114._20_4_ = 0xff800000;
  auVar114._24_4_ = 0xff800000;
  auVar114._28_4_ = 0xff800000;
  auVar91 = vblendvps_avx(auVar42,auVar114,auVar93);
  auVar87._8_4_ = 0x7f800000;
  auVar87._0_8_ = 0x7f8000007f800000;
  auVar87._12_4_ = 0x7f800000;
  auVar87._16_4_ = 0x7f800000;
  auVar87._20_4_ = 0x7f800000;
  auVar87._24_4_ = 0x7f800000;
  auVar87._28_4_ = 0x7f800000;
  auVar89 = vblendvps_avx(auVar43,auVar87,auVar93);
  auVar152._0_4_ = fVar19 + fVar163 * auVar91._0_4_;
  auVar152._4_4_ = fVar117 + fVar169 * auVar91._4_4_;
  auVar152._8_4_ = fVar121 + fVar170 * auVar91._8_4_;
  auVar152._12_4_ = fVar125 + fVar171 * auVar91._12_4_;
  auVar152._16_4_ = auVar91._16_4_ * 0.0 + 0.0;
  auVar152._20_4_ = auVar91._20_4_ * 0.0 + 0.0;
  auVar152._24_4_ = auVar91._24_4_ * 0.0 + 0.0;
  auVar152._28_4_ = auVar178._28_4_ + 0.0;
  auVar97 = ZEXT1232(ZEXT412(0)) << 0x20;
  auVar93 = vcmpps_avx(auVar152,auVar97,6);
  auVar178 = vcmpps_avx(auVar152,auVar129,1);
  auVar93 = vandps_avx(auVar178,auVar93);
  auVar29 = vpackssdw_avx(auVar93._0_16_,auVar93._16_16_);
  auVar29 = vpand_avx(auVar71,auVar29);
  auVar93 = vpmovsxwd_avx2(auVar29);
  local_520 = vblendvps_avx(auVar87,auVar91,auVar93);
  auVar178 = vpcmpeqd_avx2(auVar110,auVar97);
  local_380._0_4_ = fVar19 + fVar163 * auVar89._0_4_;
  local_380._4_4_ = fVar117 + fVar169 * auVar89._4_4_;
  fStack_378 = fVar121 + fVar170 * auVar89._8_4_;
  fStack_374 = fVar125 + fVar171 * auVar89._12_4_;
  fStack_370 = auVar89._16_4_ * 0.0 + 0.0;
  fStack_36c = auVar89._20_4_ * 0.0 + 0.0;
  fStack_368 = auVar89._24_4_ * 0.0 + 0.0;
  register0x0000125c = auVar91._28_4_ + 0.0;
  auVar93 = vcmpps_avx(_local_380,auVar97,6);
  auVar91 = vcmpps_avx(_local_380,auVar129,1);
  auVar93 = vandps_avx(auVar91,auVar93);
  auVar29 = vpackssdw_avx(auVar93._0_16_,auVar93._16_16_);
  auVar29 = vpand_avx(auVar71,auVar29);
  auVar93 = vpmovsxwd_avx2(auVar29);
  local_360 = vblendvps_avx(auVar114,auVar89,auVar93);
  auVar29 = vpackssdw_avx(auVar178._0_16_,auVar178._16_16_);
  auVar93 = vrcpps_avx(ZEXT1632(auVar28));
  auVar28 = vfnmadd213ps_fma(auVar93,ZEXT1632(auVar28),auVar186);
  auVar26 = vfmadd132ps_fma(ZEXT1632(auVar28),auVar93,auVar93);
  auVar44._4_4_ = fVar169 * (float)local_1e0._4_4_;
  auVar44._0_4_ = fVar163 * (float)local_1e0._0_4_;
  auVar44._8_4_ = fVar170 * fStack_1d8;
  auVar44._12_4_ = fVar171 * fStack_1d4;
  auVar44._16_4_ = fStack_1d0 * 0.0;
  auVar44._20_4_ = fStack_1cc * 0.0;
  auVar44._24_4_ = fStack_1c8 * 0.0;
  auVar44._28_4_ = auVar93._28_4_;
  auVar138._0_4_ = fVar4 * fVar19;
  auVar138._4_4_ = fVar4 * fVar117;
  auVar138._8_4_ = fVar4 * fVar121;
  auVar138._12_4_ = fVar4 * fVar125;
  auVar138._16_4_ = fVar4 * 0.0;
  auVar138._20_4_ = fVar4 * 0.0;
  auVar138._24_4_ = fVar4 * 0.0;
  auVar138._28_4_ = 0;
  auVar93 = vsubps_avx(auVar44,auVar138);
  auVar45._4_4_ = fVar169 * (float)local_200._4_4_;
  auVar45._0_4_ = fVar163 * (float)local_200._0_4_;
  auVar45._8_4_ = fVar170 * fStack_1f8;
  auVar45._12_4_ = fVar171 * fStack_1f4;
  auVar45._16_4_ = fStack_1f0 * 0.0;
  auVar45._20_4_ = fStack_1ec * 0.0;
  auVar45._24_4_ = fStack_1e8 * 0.0;
  auVar45._28_4_ = 0;
  auVar46._4_4_ = fVar148 * fVar117;
  auVar46._0_4_ = fVar148 * fVar19;
  auVar46._8_4_ = fVar148 * fVar121;
  auVar46._12_4_ = fVar148 * fVar125;
  auVar46._16_4_ = fVar148 * 0.0;
  auVar46._20_4_ = fVar148 * 0.0;
  auVar46._24_4_ = fVar148 * 0.0;
  auVar46._28_4_ = auVar110._28_4_;
  auVar91 = vsubps_avx(auVar45,auVar46);
  auVar47._4_4_ = fVar169 * fVar180;
  auVar47._0_4_ = fVar163 * fVar176;
  auVar47._8_4_ = fVar170 * fVar181;
  auVar47._12_4_ = fVar171 * fVar182;
  auVar47._16_4_ = fVar183 * 0.0;
  auVar47._20_4_ = fVar184 * 0.0;
  auVar47._24_4_ = fVar185 * 0.0;
  auVar47._28_4_ = auVar110._28_4_;
  auVar189._0_4_ = fVar19 * local_2c0;
  auVar189._4_4_ = fVar117 * local_2c0;
  auVar189._8_4_ = fVar121 * local_2c0;
  auVar189._12_4_ = fVar125 * local_2c0;
  auVar189._16_4_ = local_2c0 * 0.0;
  auVar189._20_4_ = local_2c0 * 0.0;
  auVar189._24_4_ = local_2c0 * 0.0;
  auVar189._28_4_ = 0;
  auVar89 = vsubps_avx(auVar47,auVar189);
  auVar48._4_4_ = auVar89._4_4_ * auVar89._4_4_;
  auVar48._0_4_ = auVar89._0_4_ * auVar89._0_4_;
  auVar48._8_4_ = auVar89._8_4_ * auVar89._8_4_;
  auVar48._12_4_ = auVar89._12_4_ * auVar89._12_4_;
  auVar48._16_4_ = auVar89._16_4_ * auVar89._16_4_;
  auVar48._20_4_ = auVar89._20_4_ * auVar89._20_4_;
  auVar48._24_4_ = auVar89._24_4_ * auVar89._24_4_;
  auVar48._28_4_ = auVar89._28_4_;
  auVar28 = vfmadd231ps_fma(auVar48,auVar91,auVar91);
  auVar28 = vfmadd231ps_fma(ZEXT1632(auVar28),auVar93,auVar93);
  auVar49._4_4_ = fVar80 * fVar131 * fVar131;
  auVar49._0_4_ = fVar70 * fVar128 * fVar128;
  auVar49._8_4_ = fVar81 * fVar132 * fVar132;
  auVar49._12_4_ = fVar82 * fVar133 * fVar133;
  auVar49._16_4_ = fVar134 * fVar134 * 0.0;
  auVar49._20_4_ = fVar135 * fVar135 * 0.0;
  auVar49._24_4_ = fVar136 * fVar136 * 0.0;
  auVar49._28_4_ = fVar146;
  auVar93 = vcmpps_avx(ZEXT1632(auVar28),auVar49,1);
  auVar177._8_4_ = 0x7f800000;
  auVar177._0_8_ = 0x7f8000007f800000;
  auVar177._12_4_ = 0x7f800000;
  auVar177._16_4_ = 0x7f800000;
  auVar177._20_4_ = 0x7f800000;
  auVar177._24_4_ = 0x7f800000;
  auVar177._28_4_ = 0x7f800000;
  auVar28 = vpackssdw_avx(auVar93._0_16_,auVar93._16_16_);
  auVar28 = vpand_avx(auVar29,auVar28);
  auVar50._4_4_ = auVar26._4_4_ * -fVar117;
  auVar50._0_4_ = auVar26._0_4_ * -fVar19;
  auVar50._8_4_ = auVar26._8_4_ * -fVar121;
  auVar50._12_4_ = auVar26._12_4_ * -fVar125;
  auVar50._16_4_ = 0x80000000;
  auVar50._20_4_ = 0x80000000;
  auVar50._24_4_ = 0x80000000;
  auVar50._28_4_ = 0x80000000;
  auVar28 = vpand_avx(auVar71,auVar28);
  auVar93 = vpmovsxwd_avx2(auVar28);
  local_280 = vblendvps_avx(auVar177,auVar50,auVar93);
  local_260._0_4_ = auVar92._0_4_;
  local_260._4_4_ = auVar92._4_4_;
  fStack_258 = auVar92._8_4_;
  fStack_254 = auVar92._12_4_;
  fStack_250 = auVar92._16_4_;
  fStack_24c = auVar92._20_4_;
  fStack_248 = auVar92._24_4_;
  auVar51._4_4_ = (float)local_260._4_4_ * fVar20;
  auVar51._0_4_ = (float)local_260._0_4_ * fVar17;
  auVar51._8_4_ = fStack_258 * fVar21;
  auVar51._12_4_ = fStack_254 * fVar22;
  auVar51._16_4_ = fStack_250 * fVar23;
  auVar51._20_4_ = fStack_24c * fVar24;
  auVar51._24_4_ = fStack_248 * fVar25;
  auVar51._28_4_ = auVar93._28_4_;
  auVar28 = vfmadd231ps_fma(auVar51,auVar83,local_320);
  auVar28 = vfmadd231ps_fma(ZEXT1632(auVar28),auVar106,local_300);
  auVar52._4_4_ = fVar169 * auVar106._4_4_;
  auVar52._0_4_ = fVar163 * auVar106._0_4_;
  auVar52._8_4_ = fVar170 * auVar106._8_4_;
  auVar52._12_4_ = fVar171 * auVar106._12_4_;
  auVar52._16_4_ = auVar106._16_4_ * 0.0;
  auVar52._20_4_ = auVar106._20_4_ * 0.0;
  auVar52._24_4_ = auVar106._24_4_ * 0.0;
  auVar52._28_4_ = auVar106._28_4_;
  auVar139._0_4_ = fVar163 * auVar83._0_4_;
  auVar139._4_4_ = fVar169 * auVar83._4_4_;
  auVar139._8_4_ = fVar170 * auVar83._8_4_;
  auVar139._12_4_ = fVar171 * auVar83._12_4_;
  auVar139._16_4_ = auVar83._16_4_ * 0.0;
  auVar139._20_4_ = auVar83._20_4_ * 0.0;
  auVar139._24_4_ = auVar83._24_4_ * 0.0;
  auVar139._28_4_ = 0;
  auVar53._4_4_ = fVar169 * (float)local_260._4_4_;
  auVar53._0_4_ = fVar163 * (float)local_260._0_4_;
  auVar53._8_4_ = fVar170 * fStack_258;
  auVar53._12_4_ = fVar171 * fStack_254;
  auVar53._16_4_ = fStack_250 * 0.0;
  auVar53._20_4_ = fStack_24c * 0.0;
  auVar53._24_4_ = fStack_248 * 0.0;
  auVar53._28_4_ = auVar83._28_4_;
  fVar19 = auVar28._0_4_;
  auVar167._0_4_ = fVar4 * fVar19;
  fVar117 = auVar28._4_4_;
  auVar167._4_4_ = fVar4 * fVar117;
  fVar121 = auVar28._8_4_;
  auVar167._8_4_ = fVar4 * fVar121;
  fVar125 = auVar28._12_4_;
  auVar167._12_4_ = fVar4 * fVar125;
  auVar167._16_4_ = fVar4 * 0.0;
  auVar167._20_4_ = fVar4 * 0.0;
  auVar167._24_4_ = fVar4 * 0.0;
  auVar167._28_4_ = 0;
  auVar93 = vsubps_avx(auVar52,auVar167);
  auVar54._4_4_ = fVar148 * fVar117;
  auVar54._0_4_ = fVar148 * fVar19;
  auVar54._8_4_ = fVar148 * fVar121;
  auVar54._12_4_ = fVar148 * fVar125;
  auVar54._16_4_ = fVar148 * 0.0;
  auVar54._20_4_ = fVar148 * 0.0;
  auVar54._24_4_ = fVar148 * 0.0;
  auVar54._28_4_ = 0;
  auVar91 = vsubps_avx(auVar139,auVar54);
  auVar55._4_4_ = local_2c0 * fVar117;
  auVar55._0_4_ = local_2c0 * fVar19;
  auVar55._8_4_ = local_2c0 * fVar121;
  auVar55._12_4_ = local_2c0 * fVar125;
  auVar55._16_4_ = local_2c0 * 0.0;
  auVar55._20_4_ = local_2c0 * 0.0;
  auVar55._24_4_ = local_2c0 * 0.0;
  auVar55._28_4_ = 0;
  auVar89 = vsubps_avx(auVar53,auVar55);
  auVar56._4_4_ = auVar89._4_4_ * auVar89._4_4_;
  auVar56._0_4_ = auVar89._0_4_ * auVar89._0_4_;
  auVar56._8_4_ = auVar89._8_4_ * auVar89._8_4_;
  auVar56._12_4_ = auVar89._12_4_ * auVar89._12_4_;
  auVar56._16_4_ = auVar89._16_4_ * auVar89._16_4_;
  auVar56._20_4_ = auVar89._20_4_ * auVar89._20_4_;
  auVar56._24_4_ = auVar89._24_4_ * auVar89._24_4_;
  auVar56._28_4_ = auVar89._28_4_;
  auVar28 = vfmadd231ps_fma(auVar56,auVar91,auVar91);
  auVar28 = vfmadd231ps_fma(ZEXT1632(auVar28),auVar93,auVar93);
  local_4a0._0_4_ = auVar96._0_4_;
  local_4a0._4_4_ = auVar96._4_4_;
  fStack_498 = auVar96._8_4_;
  fStack_494 = auVar96._12_4_;
  fStack_490 = auVar96._16_4_;
  fStack_48c = auVar96._20_4_;
  fStack_488 = auVar96._24_4_;
  auVar57._4_4_ = fVar80 * (float)local_4a0._4_4_ * (float)local_4a0._4_4_;
  auVar57._0_4_ = fVar70 * (float)local_4a0._0_4_ * (float)local_4a0._0_4_;
  auVar57._8_4_ = fVar81 * fStack_498 * fStack_498;
  auVar57._12_4_ = fVar82 * fStack_494 * fStack_494;
  auVar57._16_4_ = fStack_490 * fStack_490 * 0.0;
  auVar57._20_4_ = fStack_48c * fStack_48c * 0.0;
  auVar57._24_4_ = fStack_488 * fStack_488 * 0.0;
  auVar57._28_4_ = auVar91._28_4_;
  uVar94 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar107._4_4_ = uVar94;
  auVar107._0_4_ = uVar94;
  auVar107._8_4_ = uVar94;
  auVar107._12_4_ = uVar94;
  auVar107._16_4_ = uVar94;
  auVar107._20_4_ = uVar94;
  auVar107._24_4_ = uVar94;
  auVar107._28_4_ = uVar94;
  auVar93 = vcmpps_avx(ZEXT1632(auVar28),auVar57,1);
  auVar28 = vpackssdw_avx(auVar93._0_16_,auVar93._16_16_);
  auVar27 = vpand_avx(auVar28,auVar27);
  auVar58._4_4_ = auVar26._4_4_ * -fVar117;
  auVar58._0_4_ = auVar26._0_4_ * -fVar19;
  auVar58._8_4_ = auVar26._8_4_ * -fVar121;
  auVar58._12_4_ = auVar26._12_4_ * -fVar125;
  auVar58._16_4_ = 0x80000000;
  auVar58._20_4_ = 0x80000000;
  auVar58._24_4_ = 0x80000000;
  auVar58._28_4_ = 0x80000000;
  auVar27 = vpand_avx(auVar71,auVar27);
  auVar93 = vpmovsxwd_avx2(auVar27);
  auVar93 = vblendvps_avx(auVar177,auVar58,auVar93);
  auVar178 = vminps_avx(local_280,auVar93);
  auVar91 = vmaxps_avx(local_280,auVar93);
  auVar92 = vminps_avx(local_520,auVar178);
  auVar89 = vcmpps_avx(auVar92,auVar178,0);
  auVar93 = vcmpps_avx(auVar177,auVar91,0);
  auVar88._8_4_ = 0xff800000;
  auVar88._0_8_ = 0xff800000ff800000;
  auVar88._12_4_ = 0xff800000;
  auVar88._16_4_ = 0xff800000;
  auVar88._20_4_ = 0xff800000;
  auVar88._24_4_ = 0xff800000;
  auVar88._28_4_ = 0xff800000;
  auVar93 = vblendvps_avx(auVar91,auVar88,auVar93);
  auVar91 = vcmpps_avx(auVar177,auVar178,0);
  auVar91 = vblendvps_avx(auVar178,auVar88,auVar91);
  auVar93 = vblendvps_avx(auVar91,auVar93,auVar89);
  local_80 = vmaxps_avx(local_360,auVar93);
  auVar98._0_4_ = fVar147 + auVar92._0_4_;
  auVar98._4_4_ = fVar155 + auVar92._4_4_;
  auVar98._8_4_ = fVar156 + auVar92._8_4_;
  auVar98._12_4_ = fVar157 + auVar92._12_4_;
  auVar98._16_4_ = auVar92._16_4_ + 0.0;
  auVar98._20_4_ = auVar92._20_4_ + 0.0;
  auVar98._24_4_ = auVar92._24_4_ + 0.0;
  auVar98._28_4_ = fStack_4a4 + auVar92._28_4_;
  fVar19 = (ray->super_RayK<1>).tfar;
  auVar115._4_4_ = fVar19;
  auVar115._0_4_ = fVar19;
  auVar115._8_4_ = fVar19;
  auVar115._12_4_ = fVar19;
  auVar115._16_4_ = fVar19;
  auVar115._20_4_ = fVar19;
  auVar115._24_4_ = fVar19;
  auVar115._28_4_ = fVar19;
  auVar93 = vcmpps_avx(auVar107,auVar98,2);
  auVar91 = vcmpps_avx(auVar98,auVar115,2);
  auVar93 = vandps_avx(auVar93,auVar91);
  auVar91 = vcmpps_avx(auVar177,auVar92,4);
  auVar93 = vandps_avx(auVar93,auVar91);
  auVar27 = vpackssdw_avx(auVar93._0_16_,auVar93._16_16_);
  local_4e0 = vpand_avx(auVar71,auVar27);
  local_4a0._0_4_ = fVar147 + local_80._0_4_;
  local_4a0._4_4_ = fVar155 + local_80._4_4_;
  fStack_498 = fVar156 + local_80._8_4_;
  fStack_494 = fVar157 + local_80._12_4_;
  fStack_490 = local_80._16_4_ + 0.0;
  fStack_48c = local_80._20_4_ + 0.0;
  fStack_488 = local_80._24_4_ + 0.0;
  register0x0000139c = fStack_4a4 + local_80._28_4_;
  auVar93 = vcmpps_avx(auVar107,_local_4a0,2);
  auVar91 = vcmpps_avx(_local_4a0,auVar115,2);
  auVar93 = vandps_avx(auVar93,auVar91);
  auVar91 = vcmpps_avx(local_80,auVar88,4);
  auVar93 = vandps_avx(auVar93,auVar91);
  auVar27 = vpackssdw_avx(auVar93._0_16_,auVar93._16_16_);
  local_500 = vpand_avx(auVar71,auVar27);
  local_240 = vpor_avx(local_4e0,local_500);
  auVar93 = vpmovsxwd_avx2(local_240);
  if ((((((((auVar93 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
           (auVar93 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (auVar93 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
         SUB321(auVar93 >> 0x7f,0) == '\0') &&
        (auVar93 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
       SUB321(auVar93 >> 0xbf,0) == '\0') &&
      (auVar93 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar93[0x1f]) {
    return;
  }
  auStack_4f0 = auVar83._16_16_;
  auStack_4d0 = auVar106._16_16_;
  auVar91 = vpmovzxwd_avx2(local_4e0);
  auVar89 = vpslld_avx2(auVar91,0x1f);
  auVar91 = vblendvps_avx(local_80,auVar92,auVar89);
  auVar92 = vrcpps_avx(auVar129);
  auVar89 = vblendvps_avx(_local_380,auVar152,auVar89);
  auVar90._8_4_ = 0x3f800000;
  auVar90._0_8_ = 0x3f8000003f800000;
  auVar90._12_4_ = 0x3f800000;
  auVar90._16_4_ = 0x3f800000;
  auVar90._20_4_ = 0x3f800000;
  auVar90._24_4_ = 0x3f800000;
  auVar90._28_4_ = 0x3f800000;
  auVar29 = vfnmadd213ps_fma(auVar92,auVar129,auVar90);
  fVar128 = fVar1 * fVar18 * fVar128;
  fVar131 = fVar2 * fVar109 * fVar131;
  fVar132 = fVar3 * fVar119 * fVar132;
  fVar133 = fVar16 * fVar123 * fVar133;
  fVar134 = fVar127 * 0.0 * fVar134;
  fVar135 = fVar144 * 0.0 * fVar135;
  fVar136 = fVar145 * 0.0 * fVar136;
  local_2a0 = local_300._0_4_ * fVar128;
  fStack_29c = local_300._4_4_ * fVar131;
  fVar82 = local_300._8_4_;
  fVar95 = local_300._12_4_;
  fVar100 = local_300._16_4_;
  fVar101 = local_300._20_4_;
  fVar102 = local_300._24_4_;
  auStack_230 = auVar141._16_16_;
  local_a0 = local_300._0_4_ * fVar108;
  fStack_9c = local_300._4_4_ * fVar116;
  auVar141 = vcmpps_avx(auVar91,local_520,0);
  local_580 = auVar93;
  auVar178 = vcmpps_avx(local_360,auVar91,0);
  auVar141 = vorps_avx(auVar141,auVar178);
  auVar27 = vpackssdw_avx(auVar141._0_16_,auVar141._16_16_);
  auVar28 = vpand_avx(auVar71,auVar27);
  auVar141 = vcmpps_avx(local_280,auVar91,0);
  auVar27 = vpackssdw_avx(auVar141._0_16_,auVar141._16_16_);
  auVar71 = vpand_avx(auVar71,auVar27);
  fVar109 = auVar91._0_4_;
  fVar117 = auVar91._4_4_;
  fVar119 = auVar91._8_4_;
  fVar121 = auVar91._12_4_;
  fVar123 = auVar91._16_4_;
  fVar125 = auVar91._20_4_;
  fVar127 = auVar91._24_4_;
  fStack_298 = fVar82 * fVar132;
  fStack_294 = fVar95 * fVar133;
  fStack_290 = fVar100 * fVar134;
  fStack_28c = fVar101 * fVar135;
  fStack_288 = fVar102 * fVar136;
  fStack_284 = INFINITY;
  auVar140._0_4_ = local_2a0 + fVar191 * (fVar109 * fVar4 + (float)local_1e0._0_4_);
  auVar140._4_4_ = fStack_29c + fVar194 * (fVar117 * fVar4 + (float)local_1e0._4_4_);
  auVar140._8_4_ = fVar82 * fVar132 + fVar195 * (fVar119 * fVar4 + fStack_1d8);
  auVar140._12_4_ = fVar95 * fVar133 + fVar196 * (fVar121 * fVar4 + fStack_1d4);
  auVar140._16_4_ = fVar100 * fVar134 + (fVar123 * fVar4 + fStack_1d0) * 0.0;
  auVar140._20_4_ = fVar101 * fVar135 + (fVar125 * fVar4 + fStack_1cc) * 0.0;
  auVar140._24_4_ = fVar102 * fVar136 + (fVar127 * fVar4 + fStack_1c8) * 0.0;
  auVar140._28_4_ = fStack_1c4 + 0.0 + INFINITY;
  fStack_98 = fVar82 * fVar118;
  fStack_94 = fVar95 * fVar120;
  fStack_90 = fVar100 * fVar122;
  fStack_8c = fVar101 * fVar124;
  fStack_88 = fVar102 * fVar126;
  fStack_84 = fStack_4a4;
  fVar1 = auVar89._0_4_;
  auVar159._0_4_ = local_a0 * fVar1;
  fVar2 = auVar89._4_4_;
  auVar159._4_4_ = fStack_9c * fVar2;
  fVar3 = auVar89._8_4_;
  auVar159._8_4_ = fVar82 * fVar118 * fVar3;
  fVar4 = auVar89._12_4_;
  auVar159._12_4_ = fVar95 * fVar120 * fVar4;
  fVar16 = auVar89._16_4_;
  auVar159._16_4_ = fVar100 * fVar122 * fVar16;
  fVar18 = auVar89._20_4_;
  auVar159._20_4_ = fVar101 * fVar124 * fVar18;
  fVar19 = auVar89._24_4_;
  auVar159._24_4_ = fVar102 * fVar126 * fVar19;
  auVar159._28_4_ = 0;
  auVar89 = vsubps_avx(auVar140,auVar159);
  auVar143 = ZEXT3264(local_320);
  local_e0._0_4_ = local_320._0_4_ * fVar128;
  local_e0._4_4_ = local_320._4_4_ * fVar131;
  fVar144 = local_320._8_4_;
  fStack_d8 = fVar144 * fVar132;
  fVar145 = local_320._12_4_;
  fStack_d4 = fVar145 * fVar133;
  fVar146 = local_320._16_4_;
  fStack_d0 = fVar146 * fVar134;
  fVar70 = local_320._20_4_;
  fStack_cc = fVar70 * fVar135;
  fVar80 = local_320._24_4_;
  fStack_c8 = fVar80 * fVar136;
  fStack_c4 = 0.0;
  auVar160._0_4_ = fVar191 * (fVar109 * fVar148 + (float)local_200._0_4_) + (float)local_e0._0_4_;
  auVar160._4_4_ = fVar194 * (fVar117 * fVar148 + (float)local_200._4_4_) + (float)local_e0._4_4_;
  auVar160._8_4_ = fVar195 * (fVar119 * fVar148 + fStack_1f8) + fStack_d8;
  auVar160._12_4_ = fVar196 * (fVar121 * fVar148 + fStack_1f4) + fStack_d4;
  auVar160._16_4_ = (fVar123 * fVar148 + fStack_1f0) * 0.0 + fStack_d0;
  auVar160._20_4_ = (fVar125 * fVar148 + fStack_1ec) * 0.0 + fStack_cc;
  auVar160._24_4_ = (fVar127 * fVar148 + fStack_1e8) * 0.0 + fStack_c8;
  auVar160._28_4_ = fStack_1e4 + 0.0 + 0.0;
  fVar148 = local_320._0_4_ * fVar108;
  fVar81 = local_320._4_4_ * fVar116;
  local_c0._4_4_ = fVar81;
  local_c0._0_4_ = fVar148;
  fStack_b8 = fVar144 * fVar118;
  fStack_b4 = fVar145 * fVar120;
  fStack_b0 = fVar146 * fVar122;
  fStack_ac = fVar70 * fVar124;
  fStack_a8 = fVar80 * fVar126;
  unique0x10007b92 = 0;
  auVar59._4_4_ = fVar81 * fVar2;
  auVar59._0_4_ = fVar148 * fVar1;
  auVar59._8_4_ = fVar144 * fVar118 * fVar3;
  auVar59._12_4_ = fVar145 * fVar120 * fVar4;
  auVar59._16_4_ = fVar146 * fVar122 * fVar16;
  auVar59._20_4_ = fVar70 * fVar124 * fVar18;
  auVar59._24_4_ = fVar80 * fVar126 * fVar19;
  auVar59._28_4_ = local_280._28_4_;
  auVar178 = vsubps_avx(auVar160,auVar59);
  auVar83 = vpmovsxwd_avx2(auVar71);
  local_120._0_8_ = local_300._0_8_ ^ 0x8000000080000000;
  local_120._8_4_ = -fVar82;
  local_120._12_4_ = -fVar95;
  local_120._16_4_ = -fVar100;
  local_120._20_4_ = -fVar101;
  local_120._24_4_ = -fVar102;
  local_120._28_4_ = -fVar32;
  auVar141 = vblendvps_avx(local_300,local_120,auVar83);
  auVar96 = vpmovsxwd_avx2(auVar28);
  _local_260 = vblendvps_avx(auVar141,auVar89,auVar96);
  local_140._0_8_ = local_320._0_8_ ^ 0x8000000080000000;
  local_140._8_4_ = -fVar144;
  local_140._12_4_ = -fVar145;
  local_140._16_4_ = -fVar146;
  local_140._20_4_ = -fVar70;
  local_140._24_4_ = -fVar80;
  local_140._28_4_ = -fVar34;
  auVar141 = vblendvps_avx(local_320,local_140,auVar83);
  local_3e0 = vblendvps_avx(auVar141,auVar178,auVar96);
  auVar71 = vfmadd132ps_fma(ZEXT1632(auVar29),auVar92,auVar92);
  local_220._4_4_ = fVar20 * fVar116;
  local_220._0_4_ = fVar17 * fVar108;
  fStack_218 = fVar21 * fVar118;
  fStack_214 = fVar22 * fVar120;
  fStack_210 = fVar23 * fVar122;
  fStack_20c = fVar24 * fVar124;
  fStack_208 = fVar25 * fVar126;
  unique0x1000831e = 0;
  auVar162 = ZEXT3264(local_2e0);
  local_100 = fVar17 * fVar128;
  fStack_fc = fVar20 * fVar131;
  fStack_f8 = fVar21 * fVar132;
  fStack_f4 = fVar22 * fVar133;
  fStack_f0 = fVar23 * fVar134;
  fStack_ec = fVar24 * fVar135;
  fStack_e8 = fVar25 * fVar136;
  fStack_e4 = auVar92._28_4_;
  auVar99._0_4_ = fVar17 * fVar128 + fVar191 * (fVar176 + local_2c0 * fVar109);
  auVar99._4_4_ = fVar20 * fVar131 + fVar194 * (fVar180 + local_2c0 * fVar117);
  auVar99._8_4_ = fVar21 * fVar132 + fVar195 * (fVar181 + local_2c0 * fVar119);
  auVar99._12_4_ = fVar22 * fVar133 + fVar196 * (fVar182 + local_2c0 * fVar121);
  auVar99._16_4_ = fVar23 * fVar134 + (fVar183 + local_2c0 * fVar123) * 0.0;
  auVar99._20_4_ = fVar24 * fVar135 + (fVar184 + local_2c0 * fVar125) * 0.0;
  auVar99._24_4_ = fVar25 * fVar136 + (fVar185 + local_2c0 * fVar127) * 0.0;
  auVar99._28_4_ = auVar92._28_4_ + local_2e0._28_4_ + fVar32 + 0.0;
  auVar60._4_4_ = fVar2 * fVar20 * fVar116;
  auVar60._0_4_ = fVar1 * fVar17 * fVar108;
  auVar60._8_4_ = fVar3 * fVar21 * fVar118;
  auVar60._12_4_ = fVar4 * fVar22 * fVar120;
  auVar60._16_4_ = fVar16 * fVar23 * fVar122;
  auVar60._20_4_ = fVar18 * fVar24 * fVar124;
  auVar60._24_4_ = fVar19 * fVar25 * fVar126;
  auVar60._28_4_ = 0;
  auVar89 = vsubps_avx(auVar99,auVar60);
  local_160._0_8_ = local_340._0_8_ ^ 0x8000000080000000;
  local_160._8_4_ = -fVar21;
  local_160._12_4_ = -fVar22;
  local_160._16_4_ = -fVar23;
  local_160._20_4_ = -fVar24;
  local_160._24_4_ = -fVar25;
  local_160._28_4_ = local_340._28_4_ ^ 0x80000000;
  auVar141 = vblendvps_avx(local_340,local_160,auVar83);
  local_3c0 = vblendvps_avx(auVar141,auVar89,auVar96);
  auVar75._8_4_ = 0x3f800000;
  auVar75._0_8_ = 0x3f8000003f800000;
  auVar75._12_4_ = 0x3f800000;
  auVar75._16_4_ = 0x3f800000;
  auVar75._20_4_ = 0x3f800000;
  auVar75._24_4_ = 0x3f800000;
  auVar75._28_4_ = 0x3f800000;
  auVar141 = vandnps_avx(auVar83,auVar75);
  auVar188 = ZEXT3264(auVar141);
  _local_540 = ZEXT1632(auVar71);
  auVar61._4_4_ = fVar2 * auVar71._4_4_;
  auVar61._0_4_ = fVar1 * auVar71._0_4_;
  auVar61._8_4_ = fVar3 * auVar71._8_4_;
  auVar61._12_4_ = fVar4 * auVar71._12_4_;
  auVar61._16_4_ = fVar16 * 0.0;
  auVar61._20_4_ = fVar18 * 0.0;
  auVar61._24_4_ = fVar19 * 0.0;
  auVar61._28_4_ = auVar83._28_4_;
  local_460 = vblendvps_avx(auVar141,auVar61,auVar96);
  local_420._0_4_ = fVar109 + fVar147;
  local_420._4_4_ = fVar117 + fVar155;
  local_420._8_4_ = fVar119 + fVar156;
  local_420._12_4_ = fVar121 + fVar157;
  local_420._16_4_ = fVar123 + 0.0;
  local_420._20_4_ = fVar125 + 0.0;
  local_420._24_4_ = fVar127 + 0.0;
  local_420._28_4_ = auVar91._28_4_ + fStack_4a4;
  auVar190 = ZEXT3264(local_420);
  auVar141 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
  auVar79 = ZEXT3264(auVar141);
  local_440 = ZEXT832(0) << 0x20;
  local_400 = _local_260;
  auVar192._8_4_ = 0x7f800000;
  auVar192._0_8_ = 0x7f8000007f800000;
  auVar192._12_4_ = 0x7f800000;
  auVar192._16_4_ = 0x7f800000;
  auVar192._20_4_ = 0x7f800000;
  auVar192._24_4_ = 0x7f800000;
  auVar192._28_4_ = 0x7f800000;
  auVar193 = ZEXT3264(auVar192);
  auVar91 = vpmovzxwd_avx2(local_240);
  auVar91 = vpslld_avx2(auVar91,0x1f);
  auVar91 = vblendvps_avx(auVar192,local_420,auVar91);
  auVar89 = vshufps_avx(auVar91,auVar91,0xb1);
  auVar89 = vminps_avx(auVar91,auVar89);
  auVar178 = vshufpd_avx(auVar89,auVar89,5);
  auVar89 = vminps_avx(auVar89,auVar178);
  auVar178 = vpermpd_avx2(auVar89,0x4e);
  auVar89 = vminps_avx(auVar89,auVar178);
  auVar91 = vcmpps_avx(auVar91,auVar89,0);
  local_560 = auVar93;
  auVar89 = auVar93 & auVar91;
  auVar168 = ZEXT3264(local_480);
  auVar130 = ZEXT3264(local_300);
  auVar154 = ZEXT3264(local_340);
  auVar179 = ZEXT3264(local_520);
  if ((((((((auVar89 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar89 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar89 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar89 >> 0x7f,0) != '\0') ||
        (auVar89 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar89 >> 0xbf,0) != '\0') ||
      (auVar89 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar89[0x1f] < '\0') {
    auVar93 = vandps_avx(auVar91,auVar93);
  }
  auVar71 = auVar141._0_16_;
  uVar66 = vextractps_avx(auVar71,1);
  uVar67 = vmovmskps_avx(auVar93);
  uVar68 = 0;
  for (; (uVar67 & 1) == 0; uVar67 = uVar67 >> 1 | 0x80000000) {
    uVar68 = uVar68 + 1;
  }
  auVar175 = ZEXT1664(auVar71);
  auVar174 = ZEXT3264(CONCAT428(local_2c0,
                                CONCAT424(local_2c0,
                                          CONCAT420(local_2c0,
                                                    CONCAT416(local_2c0,
                                                              CONCAT412(local_2c0,
                                                                        CONCAT48(local_2c0,
                                                                                 CONCAT44(local_2c0,
                                                                                          local_2c0)
                                                                                )))))));
  _local_200 = auVar187;
  _local_1e0 = auVar30;
  do {
    auVar91 = auVar154._0_32_;
    auVar187 = auVar188._0_32_;
    auVar172 = auVar174._0_28_;
    auVar164 = auVar168._0_28_;
    auVar178 = auVar179._0_32_;
    auVar141 = auVar143._0_32_;
    auVar93 = auVar130._0_32_;
    auVar89 = auVar162._0_32_;
    uVar69 = (ulong)uVar68;
    local_598 = local_180[uVar69];
    pGVar13 = (pSVar12->geometries).items[local_598].ptr;
    if ((pGVar13->mask & uVar66) == 0) {
      *(undefined4 *)(local_560 + uVar69 * 4) = 0;
    }
    else {
      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
         (pGVar13->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
        fVar1 = *(float *)(local_460 + uVar69 * 4);
        fVar2 = *(float *)(local_440 + uVar69 * 4);
        local_580._0_4_ = *(float *)(local_420 + uVar69 * 4);
        (ray->super_RayK<1>).tfar = *(float *)(local_420 + uVar69 * 4);
        (ray->Ng).field_0.field_0.x = *(float *)(local_400 + uVar69 * 4);
        (ray->Ng).field_0.field_0.y = *(float *)(local_3e0 + uVar69 * 4);
        (ray->Ng).field_0.field_0.z = *(float *)(local_3c0 + uVar69 * 4);
        ray->u = fVar1;
        ray->v = fVar2;
        ray->primID = (line->primIDs).field_0.i[uVar69];
        ray->geomID = local_598;
        ray->instID[0] = context->user->instID[0];
        ray->instPrimID[0] = context->user->instPrimID[0];
        uVar94 = SUB324(*(undefined1 (*) [32])&(ray->super_RayK<1>).tfar,0);
        uVar66 = (ray->super_RayK<1>).mask;
        goto LAB_012a687d;
      }
      local_3a0 = auVar190._0_32_;
      _local_4c0 = auVar187;
      local_580._0_4_ = auVar175._0_4_;
      local_5b0 = *(float *)(local_400 + uVar69 * 4);
      local_5ac = *(undefined4 *)(local_3e0 + uVar69 * 4);
      local_5a8 = *(undefined4 *)(local_3c0 + uVar69 * 4);
      local_5a4 = *(undefined4 *)(local_460 + uVar69 * 4);
      local_5a0 = *(undefined4 *)(local_440 + uVar69 * 4);
      local_59c = (line->primIDs).field_0.i[uVar69];
      local_594 = context->user->instID[0];
      local_590 = context->user->instPrimID[0];
      (ray->super_RayK<1>).tfar = *(float *)(local_420 + uVar69 * 4);
      local_5ec = -1;
      local_5e0.valid = &local_5ec;
      local_5e0.geometryUserPtr = pGVar13->userPtr;
      local_5e0.context = context->user;
      local_5e0.ray = (RTCRayN *)ray;
      local_5e0.hit = (RTCHitN *)&local_5b0;
      local_5e0.N = 1;
      if ((pGVar13->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
         ((*pGVar13->intersectionFilterN)(&local_5e0), context = local_5e8, *local_5e0.valid != 0))
      {
        p_Var15 = context->args->filter;
        if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
           ((((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
              RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar13->field_8).field_0x2 & 0x40) != 0)) &&
            ((*p_Var15)(&local_5e0), context = local_5e8, *local_5e0.valid == 0))))
        goto LAB_012a673a;
        (((Vec3f *)((long)local_5e0.ray + 0x30))->field_0).field_0.x = *(float *)local_5e0.hit;
        (((Vec3f *)((long)local_5e0.ray + 0x30))->field_0).field_0.y = *(float *)(local_5e0.hit + 4)
        ;
        (((Vec3f *)((long)local_5e0.ray + 0x30))->field_0).field_0.z = *(float *)(local_5e0.hit + 8)
        ;
        *(float *)((long)local_5e0.ray + 0x3c) = *(float *)(local_5e0.hit + 0xc);
        *(float *)((long)local_5e0.ray + 0x40) = *(float *)(local_5e0.hit + 0x10);
        *(float *)((long)local_5e0.ray + 0x44) = *(float *)(local_5e0.hit + 0x14);
        *(float *)((long)local_5e0.ray + 0x48) = *(float *)(local_5e0.hit + 0x18);
        *(float *)((long)local_5e0.ray + 0x4c) = *(float *)(local_5e0.hit + 0x1c);
        *(float *)((long)local_5e0.ray + 0x50) = *(float *)(local_5e0.hit + 0x20);
      }
      else {
LAB_012a673a:
        (ray->super_RayK<1>).tfar = (float)local_580._0_4_;
        context = local_5e8;
      }
      auVar193 = ZEXT3264(CONCAT428(0x7f800000,
                                    CONCAT424(0x7f800000,
                                              CONCAT420(0x7f800000,
                                                        CONCAT416(0x7f800000,
                                                                  CONCAT412(0x7f800000,
                                                                            CONCAT48(0x7f800000,
                                                                                                                                                                          
                                                  0x7f8000007f800000)))))));
      auVar174 = ZEXT3264(CONCAT428(fStack_2a4,
                                    CONCAT424(fStack_2a8,
                                              CONCAT420(fStack_2ac,
                                                        CONCAT416(fStack_2b0,
                                                                  CONCAT412(fStack_2b4,
                                                                            CONCAT48(fStack_2b8,
                                                                                     CONCAT44(
                                                  fStack_2bc,local_2c0))))))));
      auVar168 = ZEXT3264(local_480);
      auVar162 = ZEXT3264(local_2e0);
      auVar130 = ZEXT3264(local_300);
      auVar143 = ZEXT3264(local_320);
      auVar154 = ZEXT3264(local_340);
      auVar179 = ZEXT3264(local_520);
      auVar188 = ZEXT3264(_local_4c0);
      *(undefined4 *)(local_560 + uVar69 * 4) = 0;
      fVar1 = (ray->super_RayK<1>).tfar;
      auVar76._4_4_ = fVar1;
      auVar76._0_4_ = fVar1;
      auVar76._8_4_ = fVar1;
      auVar76._12_4_ = fVar1;
      auVar76._16_4_ = fVar1;
      auVar76._20_4_ = fVar1;
      auVar76._24_4_ = fVar1;
      auVar76._28_4_ = fVar1;
      auVar190 = ZEXT3264(local_3a0);
      auVar93 = vcmpps_avx(local_3a0,auVar76,2);
      local_560 = vandps_avx(auVar93,local_560);
      auVar79 = ZEXT3264(*(undefined1 (*) [32])&(ray->super_RayK<1>).tfar);
      uVar66 = (ray->super_RayK<1>).mask;
      auVar175 = ZEXT464((uint)(ray->super_RayK<1>).tfar);
    }
    uVar94 = auVar79._0_4_;
    auVar91 = auVar154._0_32_;
    auVar187 = auVar188._0_32_;
    auVar172 = auVar174._0_28_;
    auVar164 = auVar168._0_28_;
    auVar178 = auVar179._0_32_;
    auVar141 = auVar143._0_32_;
    auVar93 = auVar130._0_32_;
    auVar89 = auVar162._0_32_;
    if ((((((((local_560 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (local_560 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (local_560 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(local_560 >> 0x7f,0) == '\0') &&
          (local_560 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(local_560 >> 0xbf,0) == '\0') &&
        (local_560 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
        -1 < local_560[0x1f]) break;
    auVar93 = vblendvps_avx(auVar193._0_32_,auVar190._0_32_,local_560);
    auVar141 = vshufps_avx(auVar93,auVar93,0xb1);
    auVar141 = vminps_avx(auVar93,auVar141);
    auVar91 = vshufpd_avx(auVar141,auVar141,5);
    auVar141 = vminps_avx(auVar141,auVar91);
    auVar91 = vpermpd_avx2(auVar141,0x4e);
    auVar141 = vminps_avx(auVar141,auVar91);
    auVar141 = vcmpps_avx(auVar93,auVar141,0);
    auVar91 = local_560 & auVar141;
    auVar93 = local_560;
    if ((((((((auVar91 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar91 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar91 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar91 >> 0x7f,0) != '\0') ||
          (auVar91 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar91 >> 0xbf,0) != '\0') ||
        (auVar91 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar91[0x1f] < '\0')
    {
      auVar93 = vandps_avx(auVar141,local_560);
    }
    uVar67 = vmovmskps_avx(auVar93);
    uVar68 = 0;
    for (; (uVar67 & 1) == 0; uVar67 = uVar67 >> 1 | 0x80000000) {
      uVar68 = uVar68 + 1;
    }
  } while( true );
  local_580._0_4_ = auVar175._0_4_;
LAB_012a687d:
  auVar27 = vpand_avx(local_500,local_4e0);
  auVar77._4_4_ = uVar94;
  auVar77._0_4_ = uVar94;
  auVar77._8_4_ = uVar94;
  auVar77._12_4_ = uVar94;
  auVar77._16_4_ = uVar94;
  auVar77._20_4_ = uVar94;
  auVar77._24_4_ = uVar94;
  auVar77._28_4_ = uVar94;
  auVar79 = ZEXT3264(_local_4a0);
  auVar92 = vcmpps_avx(_local_4a0,auVar77,2);
  auVar71 = vpackssdw_avx(auVar92._0_16_,auVar92._16_16_);
  auVar71 = vpand_avx(auVar71,auVar27);
  auVar92 = vpmovzxwd_avx2(auVar71);
  auVar92 = vpslld_avx2(auVar92,0x1f);
  if ((((((((auVar92 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
           (auVar92 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (auVar92 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
         SUB321(auVar92 >> 0x7f,0) == '\0') &&
        (auVar92 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
       SUB321(auVar92 >> 0xbf,0) == '\0') &&
      (auVar92 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar92[0x1f]) {
    return;
  }
  auVar83 = vcmpps_avx(local_80,local_280,0);
  auVar93 = vblendvps_avx(auVar93,local_120,auVar83);
  auVar141 = vblendvps_avx(auVar141,local_140,auVar83);
  auVar83 = vblendvps_avx(auVar91,local_160,auVar83);
  auVar178 = vcmpps_avx(local_80,auVar178,0);
  auVar96 = vcmpps_avx(local_80,local_360,0);
  auVar178 = vorps_avx(auVar178,auVar96);
  fVar1 = local_80._0_4_;
  fVar2 = local_80._4_4_;
  fVar148 = local_80._8_4_;
  fVar3 = local_80._12_4_;
  fVar4 = local_80._16_4_;
  fVar16 = local_80._20_4_;
  fVar17 = local_80._24_4_;
  auVar142._0_4_ =
       (float)local_1a0._0_4_ * (auVar164._0_4_ * fVar1 + (float)local_1e0._0_4_) + local_2a0;
  auVar142._4_4_ =
       (float)local_1a0._4_4_ * (auVar164._4_4_ * fVar2 + (float)local_1e0._4_4_) + fStack_29c;
  auVar142._8_4_ = fStack_198 * (auVar164._8_4_ * fVar148 + fStack_1d8) + fStack_298;
  auVar142._12_4_ = fStack_194 * (auVar164._12_4_ * fVar3 + fStack_1d4) + fStack_294;
  auVar142._16_4_ = fStack_190 * (auVar164._16_4_ * fVar4 + fStack_1d0) + fStack_290;
  auVar142._20_4_ = fStack_18c * (auVar164._20_4_ * fVar16 + fStack_1cc) + fStack_28c;
  auVar142._24_4_ = fStack_188 * (auVar164._24_4_ * fVar17 + fStack_1c8) + fStack_288;
  auVar142._28_4_ = auVar96._28_4_ + fStack_1c4 + fStack_284;
  auVar153._0_4_ =
       (float)local_1a0._0_4_ * (fVar1 * (float)local_1c0._0_4_ + (float)local_200._0_4_) +
       (float)local_e0._0_4_;
  auVar153._4_4_ =
       (float)local_1a0._4_4_ * (fVar2 * (float)local_1c0._4_4_ + (float)local_200._4_4_) +
       (float)local_e0._4_4_;
  auVar153._8_4_ = fStack_198 * (fVar148 * fStack_1b8 + fStack_1f8) + fStack_d8;
  auVar153._12_4_ = fStack_194 * (fVar3 * fStack_1b4 + fStack_1f4) + fStack_d4;
  auVar153._16_4_ = fStack_190 * (fVar4 * fStack_1b0 + fStack_1f0) + fStack_d0;
  auVar153._20_4_ = fStack_18c * (fVar16 * fStack_1ac + fStack_1ec) + fStack_cc;
  auVar153._24_4_ = fStack_188 * (fVar17 * fStack_1a8 + fStack_1e8) + fStack_c8;
  auVar153._28_4_ = auVar91._28_4_ + fStack_1e4 + fStack_c4;
  auVar161._0_4_ = (float)local_1a0._0_4_ * (auVar89._0_4_ + auVar172._0_4_ * fVar1) + local_100;
  auVar161._4_4_ = (float)local_1a0._4_4_ * (auVar89._4_4_ + auVar172._4_4_ * fVar2) + fStack_fc;
  auVar161._8_4_ = fStack_198 * (auVar89._8_4_ + auVar172._8_4_ * fVar148) + fStack_f8;
  auVar161._12_4_ = fStack_194 * (auVar89._12_4_ + auVar172._12_4_ * fVar3) + fStack_f4;
  auVar161._16_4_ = fStack_190 * (auVar89._16_4_ + auVar172._16_4_ * fVar4) + fStack_f0;
  auVar161._20_4_ = fStack_18c * (auVar89._20_4_ + auVar172._20_4_ * fVar16) + fStack_ec;
  auVar161._24_4_ = fStack_188 * (auVar89._24_4_ + auVar172._24_4_ * fVar17) + fStack_e8;
  auVar161._28_4_ = auVar89._28_4_ + local_80._28_4_ + fStack_e4;
  auVar62._4_4_ = (float)local_380._4_4_ * fStack_9c;
  auVar62._0_4_ = (float)local_380._0_4_ * local_a0;
  auVar62._8_4_ = fStack_378 * fStack_98;
  auVar62._12_4_ = fStack_374 * fStack_94;
  auVar62._16_4_ = fStack_370 * fStack_90;
  auVar62._20_4_ = fStack_36c * fStack_8c;
  auVar62._24_4_ = fStack_368 * fStack_88;
  auVar62._28_4_ = uStack_184;
  auVar91 = vsubps_avx(auVar142,auVar62);
  auVar63._4_4_ = (float)local_380._4_4_ * (float)local_c0._4_4_;
  auVar63._0_4_ = (float)local_380._0_4_ * (float)local_c0._0_4_;
  auVar63._8_4_ = fStack_378 * fStack_b8;
  auVar63._12_4_ = fStack_374 * fStack_b4;
  auVar63._16_4_ = fStack_370 * fStack_b0;
  auVar63._20_4_ = fStack_36c * fStack_ac;
  auVar63._24_4_ = fStack_368 * fStack_a8;
  auVar63._28_4_ = uStack_184;
  auVar89 = vsubps_avx(auVar153,auVar63);
  auVar64._4_4_ = (float)local_380._4_4_ * (float)local_220._4_4_;
  auVar64._0_4_ = (float)local_380._0_4_ * (float)local_220._0_4_;
  auVar64._8_4_ = fStack_378 * fStack_218;
  auVar64._12_4_ = fStack_374 * fStack_214;
  auVar64._16_4_ = fStack_370 * fStack_210;
  auVar64._20_4_ = fStack_36c * fStack_20c;
  auVar64._24_4_ = fStack_368 * fStack_208;
  auVar64._28_4_ = uStack_184;
  auVar96 = vsubps_avx(auVar161,auVar64);
  local_400 = vblendvps_avx(auVar93,auVar91,auVar178);
  local_3e0 = vblendvps_avx(auVar141,auVar89,auVar178);
  local_3c0 = vblendvps_avx(auVar83,auVar96,auVar178);
  auVar65._4_4_ = (float)local_380._4_4_ * (float)local_540._4_4_;
  auVar65._0_4_ = (float)local_380._0_4_ * (float)local_540._0_4_;
  auVar65._8_4_ = fStack_378 * fStack_538;
  auVar65._12_4_ = fStack_374 * fStack_534;
  auVar65._16_4_ = fStack_370 * fStack_530;
  auVar65._20_4_ = fStack_36c * fStack_52c;
  auVar65._24_4_ = fStack_368 * fStack_528;
  auVar65._28_4_ = auVar91._28_4_;
  local_460 = vblendvps_avx(auVar187,auVar65,auVar178);
  local_440 = ZEXT832(0) << 0x20;
  local_420 = _local_4a0;
  auVar93 = vblendvps_avx(auVar193._0_32_,_local_4a0,auVar92);
  auVar141 = vshufps_avx(auVar93,auVar93,0xb1);
  auVar141 = vminps_avx(auVar93,auVar141);
  auVar91 = vshufpd_avx(auVar141,auVar141,5);
  auVar141 = vminps_avx(auVar141,auVar91);
  auVar91 = vpermpd_avx2(auVar141,0x4e);
  auVar141 = vminps_avx(auVar141,auVar91);
  auVar93 = vcmpps_avx(auVar93,auVar141,0);
  auVar27 = vpackssdw_avx(auVar93._0_16_,auVar93._16_16_);
  auVar71 = vpand_avx(auVar27,auVar71);
  local_560 = vpsrad_avx2(auVar92,0x1f);
  pSVar12 = context->scene;
  auVar93 = vpmovzxwd_avx2(auVar71);
  auVar93 = vpslld_avx2(auVar93,0x1f);
  if ((((((((auVar93 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
           (auVar93 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (auVar93 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
         SUB321(auVar93 >> 0x7f,0) == '\0') &&
        (auVar93 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
       SUB321(auVar93 >> 0xbf,0) == '\0') &&
      (auVar93 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar93[0x1f]) {
    auVar93 = local_560;
  }
  uVar67 = vmovmskps_avx(auVar93);
  uVar68 = 0;
  for (; (uVar67 & 1) == 0; uVar67 = uVar67 >> 1 | 0x80000000) {
    uVar68 = uVar68 + 1;
  }
  do {
    uVar69 = (ulong)uVar68;
    local_598 = local_180[uVar69];
    pGVar13 = (pSVar12->geometries).items[local_598].ptr;
    if ((pGVar13->mask & uVar66) == 0) {
      *(undefined4 *)(local_560 + uVar69 * 4) = 0;
    }
    else {
      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
         (pGVar13->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
        fVar1 = *(float *)(local_460 + uVar69 * 4);
        fVar2 = *(float *)(local_440 + uVar69 * 4);
        (ray->super_RayK<1>).tfar = *(float *)(local_420 + uVar69 * 4);
        (ray->Ng).field_0.field_0.x = *(float *)(local_400 + uVar69 * 4);
        (ray->Ng).field_0.field_0.y = *(float *)(local_3e0 + uVar69 * 4);
        (ray->Ng).field_0.field_0.z = *(float *)(local_3c0 + uVar69 * 4);
        ray->u = fVar1;
        ray->v = fVar2;
        ray->primID = (line->primIDs).field_0.i[uVar69];
        ray->geomID = local_598;
        ray->instID[0] = context->user->instID[0];
        ray->instPrimID[0] = context->user->instPrimID[0];
        return;
      }
      local_5b0 = *(float *)(local_400 + uVar69 * 4);
      local_5ac = *(undefined4 *)(local_3e0 + uVar69 * 4);
      local_5a8 = *(undefined4 *)(local_3c0 + uVar69 * 4);
      local_5a4 = *(undefined4 *)(local_460 + uVar69 * 4);
      local_5a0 = *(undefined4 *)(local_440 + uVar69 * 4);
      local_59c = (line->primIDs).field_0.i[uVar69];
      local_594 = context->user->instID[0];
      local_590 = context->user->instPrimID[0];
      (ray->super_RayK<1>).tfar = *(float *)(local_420 + uVar69 * 4);
      local_5ec = -1;
      local_5e0.valid = &local_5ec;
      local_5e0.geometryUserPtr = pGVar13->userPtr;
      local_5e0.context = context->user;
      local_5e0.ray = (RTCRayN *)ray;
      local_5e0.hit = (RTCHitN *)&local_5b0;
      local_5e0.N = 1;
      if ((pGVar13->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
         ((*pGVar13->intersectionFilterN)(&local_5e0), context = local_5e8, *local_5e0.valid != 0))
      {
        p_Var15 = context->args->filter;
        if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
           ((((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
              RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar13->field_8).field_0x2 & 0x40) != 0)) &&
            ((*p_Var15)(&local_5e0), context = local_5e8, *local_5e0.valid == 0))))
        goto LAB_012a6c57;
        (((Vec3f *)((long)local_5e0.ray + 0x30))->field_0).field_0.x = *(float *)local_5e0.hit;
        (((Vec3f *)((long)local_5e0.ray + 0x30))->field_0).field_0.y = *(float *)(local_5e0.hit + 4)
        ;
        (((Vec3f *)((long)local_5e0.ray + 0x30))->field_0).field_0.z = *(float *)(local_5e0.hit + 8)
        ;
        *(float *)((long)local_5e0.ray + 0x3c) = *(float *)(local_5e0.hit + 0xc);
        *(float *)((long)local_5e0.ray + 0x40) = *(float *)(local_5e0.hit + 0x10);
        *(float *)((long)local_5e0.ray + 0x44) = *(float *)(local_5e0.hit + 0x14);
        *(float *)((long)local_5e0.ray + 0x48) = *(float *)(local_5e0.hit + 0x18);
        *(float *)((long)local_5e0.ray + 0x4c) = *(float *)(local_5e0.hit + 0x1c);
        *(float *)((long)local_5e0.ray + 0x50) = *(float *)(local_5e0.hit + 0x20);
      }
      else {
LAB_012a6c57:
        (ray->super_RayK<1>).tfar = (float)local_580._0_4_;
        context = local_5e8;
      }
      auVar193 = ZEXT3264(CONCAT428(0x7f800000,
                                    CONCAT424(0x7f800000,
                                              CONCAT420(0x7f800000,
                                                        CONCAT416(0x7f800000,
                                                                  CONCAT412(0x7f800000,
                                                                            CONCAT48(0x7f800000,
                                                                                                                                                                          
                                                  0x7f8000007f800000)))))));
      *(undefined4 *)(local_560 + uVar69 * 4) = 0;
      fVar1 = (ray->super_RayK<1>).tfar;
      auVar78._4_4_ = fVar1;
      auVar78._0_4_ = fVar1;
      auVar78._8_4_ = fVar1;
      auVar78._12_4_ = fVar1;
      auVar78._16_4_ = fVar1;
      auVar78._20_4_ = fVar1;
      auVar78._24_4_ = fVar1;
      auVar78._28_4_ = fVar1;
      auVar79 = ZEXT3264(_local_4a0);
      auVar93 = vcmpps_avx(_local_4a0,auVar78,2);
      local_560 = vandps_avx(auVar93,local_560);
      uVar66 = (ray->super_RayK<1>).mask;
      local_580._0_4_ = (ray->super_RayK<1>).tfar;
    }
    if ((((((((local_560 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (local_560 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (local_560 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(local_560 >> 0x7f,0) == '\0') &&
          (local_560 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(local_560 >> 0xbf,0) == '\0') &&
        (local_560 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
        -1 < local_560[0x1f]) {
      return;
    }
    auVar93 = vblendvps_avx(auVar193._0_32_,auVar79._0_32_,local_560);
    auVar141 = vshufps_avx(auVar93,auVar93,0xb1);
    auVar141 = vminps_avx(auVar93,auVar141);
    auVar91 = vshufpd_avx(auVar141,auVar141,5);
    auVar141 = vminps_avx(auVar141,auVar91);
    auVar91 = vpermpd_avx2(auVar141,0x4e);
    auVar141 = vminps_avx(auVar141,auVar91);
    auVar141 = vcmpps_avx(auVar93,auVar141,0);
    auVar91 = local_560 & auVar141;
    auVar93 = local_560;
    if ((((((((auVar91 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar91 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar91 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar91 >> 0x7f,0) != '\0') ||
          (auVar91 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar91 >> 0xbf,0) != '\0') ||
        (auVar91 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar91[0x1f] < '\0')
    {
      auVar93 = vandps_avx(auVar141,local_560);
    }
    uVar67 = vmovmskps_avx(auVar93);
    uVar68 = 0;
    for (; (uVar67 & 1) == 0; uVar67 = uVar67 >> 1 | 0x80000000) {
      uVar68 = uVar68 + 1;
    }
  } while( true );
}

Assistant:

static __forceinline void intersect(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& line)
      {
        STAT3(normal.trav_prims,1,1,1);
        const LineSegments* geom = context->scene->get<LineSegments>(line.geomID());
        Vec4vf<M> v0,v1; 
        vbool<M> cL,cR;
        line.gather(v0,v1,cL,cR,geom);
        const vbool<M> valid = line.valid();
        ConeCurveIntersector1<M>::intersect(valid,ray,context,geom,pre,v0,v1,cL,cR,Intersect1EpilogM<M,filter>(ray,context,line.geomID(),line.primID()));
      }